

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O2

void __thiscall Shell::buildSpectestModule(Shell *this)

{
  undefined8 uVar1;
  Const *pCVar2;
  undefined8 *puVar3;
  Name NVar4;
  Name name;
  Name name_00;
  Name name_01;
  Name name_02;
  Name name_03;
  Name name_04;
  Name name_05;
  Name local_158;
  Name local_148;
  Name local_138;
  Name local_128;
  Name local_118;
  Name local_108;
  Name local_f8;
  Address local_e8;
  Address local_e0;
  undefined1 auStack_d8 [8];
  Result<wasm::Ok> added;
  Register registration;
  Builder builder;
  undefined1 local_60 [8];
  Result<wasm::Ok> registered;
  shared_ptr<wasm::Module> spectest;
  
  std::make_shared<wasm::Module>();
  uVar1 = registered.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
  *(undefined4 *)
   (registered.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ + 0x178) = 0x3fffff;
  registration.name.super_IString.str._M_str =
       (char *)registered.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
  NVar4 = wasm::Name::fromInt(0);
  pCVar2 = wasm::Builder::makeConst<unsigned_int>
                     ((Builder *)&registration.name.super_IString.str._M_str,0x29a);
  name.super_IString.str._M_str = NVar4.super_IString.str._M_len;
  name.super_IString.str._M_len = (size_t)&builder;
  wasm::Builder::makeGlobal
            (name,(Type)NVar4.super_IString.str._M_str,(Expression *)0x2,(Mutability)pCVar2);
  wasm::Module::addGlobal((unique_ptr *)uVar1);
  std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr
            ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)&builder);
  uVar1 = registered.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
  NVar4 = wasm::Name::fromInt(1);
  pCVar2 = wasm::Builder::makeConst<unsigned_long>
                     ((Builder *)&registration.name.super_IString.str._M_str,0x29a);
  name_00.super_IString.str._M_str = NVar4.super_IString.str._M_len;
  name_00.super_IString.str._M_len = (size_t)&builder;
  wasm::Builder::makeGlobal
            (name_00,(Type)NVar4.super_IString.str._M_str,(Expression *)0x3,(Mutability)pCVar2);
  wasm::Module::addGlobal((unique_ptr *)uVar1);
  std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr
            ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)&builder);
  uVar1 = registered.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
  NVar4 = wasm::Name::fromInt(2);
  pCVar2 = wasm::Builder::makeConst<float>
                     ((Builder *)&registration.name.super_IString.str._M_str,666.6);
  name_01.super_IString.str._M_str = NVar4.super_IString.str._M_len;
  name_01.super_IString.str._M_len = (size_t)&builder;
  wasm::Builder::makeGlobal
            (name_01,(Type)NVar4.super_IString.str._M_str,(Expression *)0x4,(Mutability)pCVar2);
  wasm::Module::addGlobal((unique_ptr *)uVar1);
  std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr
            ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)&builder);
  uVar1 = registered.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
  NVar4 = wasm::Name::fromInt(3);
  pCVar2 = wasm::Builder::makeConst<double>
                     ((Builder *)&registration.name.super_IString.str._M_str,666.6);
  name_02.super_IString.str._M_str = NVar4.super_IString.str._M_len;
  name_02.super_IString.str._M_len = (size_t)&builder;
  wasm::Builder::makeGlobal
            (name_02,(Type)NVar4.super_IString.str._M_str,(Expression *)0x5,(Mutability)pCVar2);
  wasm::Module::addGlobal((unique_ptr *)uVar1);
  std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr
            ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)&builder);
  uVar1 = registered.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
  wasm::Name::Name(&local_158,"global_i32");
  _builder = (undefined1  [16])wasm::Name::fromInt(0);
  auStack_d8 = (undefined1  [8])local_158.super_IString.str._M_len;
  added.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u
  ._0_8_ = local_158.super_IString.str._M_str;
  added.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _M_index = '\x03';
  added.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _33_3_ = 0;
  std::
  make_unique<wasm::Export,wasm::Name&,wasm::ExternalKind&,std::variant<wasm::Name,wasm::HeapType>&>
            ((Name *)local_60,(ExternalKind *)auStack_d8,
             (variant<wasm::Name,_wasm::HeapType> *)
             ((long)&added.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  wasm::Module::addExport((unique_ptr *)uVar1);
  std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr
            ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)local_60);
  uVar1 = registered.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
  wasm::Name::Name(&local_148,"global_i64");
  _builder = (undefined1  [16])wasm::Name::fromInt(1);
  auStack_d8 = (undefined1  [8])local_148.super_IString.str._M_len;
  added.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u
  ._0_8_ = local_148.super_IString.str._M_str;
  added.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _M_index = '\x03';
  added.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _33_3_ = 0;
  std::
  make_unique<wasm::Export,wasm::Name&,wasm::ExternalKind&,std::variant<wasm::Name,wasm::HeapType>&>
            ((Name *)local_60,(ExternalKind *)auStack_d8,
             (variant<wasm::Name,_wasm::HeapType> *)
             ((long)&added.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  wasm::Module::addExport((unique_ptr *)uVar1);
  std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr
            ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)local_60);
  uVar1 = registered.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
  wasm::Name::Name(&local_138,"global_f32");
  _builder = (undefined1  [16])wasm::Name::fromInt(2);
  auStack_d8 = (undefined1  [8])local_138.super_IString.str._M_len;
  added.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u
  ._0_8_ = local_138.super_IString.str._M_str;
  added.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _M_index = '\x03';
  added.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _33_3_ = 0;
  std::
  make_unique<wasm::Export,wasm::Name&,wasm::ExternalKind&,std::variant<wasm::Name,wasm::HeapType>&>
            ((Name *)local_60,(ExternalKind *)auStack_d8,
             (variant<wasm::Name,_wasm::HeapType> *)
             ((long)&added.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  wasm::Module::addExport((unique_ptr *)uVar1);
  std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr
            ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)local_60);
  uVar1 = registered.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
  wasm::Name::Name(&local_128,"global_f64");
  _builder = (undefined1  [16])wasm::Name::fromInt(3);
  auStack_d8 = (undefined1  [8])local_128.super_IString.str._M_len;
  added.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u
  ._0_8_ = local_128.super_IString.str._M_str;
  added.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _M_index = '\x03';
  added.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _33_3_ = 0;
  std::
  make_unique<wasm::Export,wasm::Name&,wasm::ExternalKind&,std::variant<wasm::Name,wasm::HeapType>&>
            ((Name *)local_60,(ExternalKind *)auStack_d8,
             (variant<wasm::Name,_wasm::HeapType> *)
             ((long)&added.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  wasm::Module::addExport((unique_ptr *)uVar1);
  std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr
            ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)local_60);
  uVar1 = registered.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
  NVar4 = wasm::Name::fromInt(0);
  wasm::Type::Type((Type *)&local_e8,(HeapType)0x10,Nullable,Inexact);
  name_03.super_IString.str._M_str = NVar4.super_IString.str._M_len;
  name_03.super_IString.str._M_len = (size_t)&builder;
  wasm::Builder::makeTable
            (name_03,(Type)NVar4.super_IString.str._M_str,local_e8,(Address)0xa,(Type)0x14);
  wasm::Module::addTable((unique_ptr *)uVar1);
  std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::~unique_ptr
            ((unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)&builder);
  uVar1 = registered.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
  wasm::Name::Name(&local_118,"table");
  _builder = (undefined1  [16])wasm::Name::fromInt(0);
  auStack_d8 = (undefined1  [8])local_118.super_IString.str._M_len;
  added.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u
  ._0_8_ = local_118.super_IString.str._M_str;
  added.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _M_index = '\x01';
  added.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _33_3_ = 0;
  std::
  make_unique<wasm::Export,wasm::Name&,wasm::ExternalKind&,std::variant<wasm::Name,wasm::HeapType>&>
            ((Name *)local_60,(ExternalKind *)auStack_d8,
             (variant<wasm::Name,_wasm::HeapType> *)
             ((long)&added.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  wasm::Module::addExport((unique_ptr *)uVar1);
  std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr
            ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)local_60);
  uVar1 = registered.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
  NVar4 = wasm::Name::fromInt(1);
  wasm::Type::Type((Type *)&local_e0,(HeapType)0x10,Nullable,Inexact);
  name_04.super_IString.str._M_str = NVar4.super_IString.str._M_len;
  name_04.super_IString.str._M_len = (size_t)&builder;
  wasm::Builder::makeTable
            (name_04,(Type)NVar4.super_IString.str._M_str,local_e0,(Address)0xa,(Type)0x14);
  wasm::Module::addTable((unique_ptr *)uVar1);
  std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::~unique_ptr
            ((unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)&builder);
  uVar1 = registered.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
  wasm::Name::Name(&local_108,"table64");
  _builder = (undefined1  [16])wasm::Name::fromInt(1);
  auStack_d8 = (undefined1  [8])local_108.super_IString.str._M_len;
  added.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u
  ._0_8_ = local_108.super_IString.str._M_str;
  added.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _M_index = '\x01';
  added.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _33_3_ = 0;
  std::
  make_unique<wasm::Export,wasm::Name&,wasm::ExternalKind&,std::variant<wasm::Name,wasm::HeapType>&>
            ((Name *)local_60,(ExternalKind *)auStack_d8,
             (variant<wasm::Name,_wasm::HeapType> *)
             ((long)&added.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  wasm::Module::addExport((unique_ptr *)uVar1);
  std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr
            ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)local_60);
  uVar1 = registered.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
  NVar4 = wasm::Name::fromInt(0);
  name_05.super_IString.str._M_str = NVar4.super_IString.str._M_len;
  name_05.super_IString.str._M_len = (size_t)&builder;
  wasm::Builder::makeMemory
            (name_05,(Address)NVar4.super_IString.str._M_str,(Address)0x1,true,(Type)0x0);
  puVar3 = (undefined8 *)wasm::Module::addMemory((unique_ptr *)uVar1);
  std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::~unique_ptr
            ((unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)&builder);
  wasm::Name::Name(&local_f8,"memory");
  builder.wasm = (Module *)*puVar3;
  auStack_d8 = (undefined1  [8])local_f8.super_IString.str._M_len;
  added.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u
  ._0_8_ = local_f8.super_IString.str._M_str;
  added.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _M_index = '\x02';
  added.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _33_3_ = 0;
  std::
  make_unique<wasm::Export,wasm::Name&,wasm::ExternalKind&,std::variant<wasm::Name,wasm::HeapType>&>
            ((Name *)local_60,(ExternalKind *)auStack_d8,
             (variant<wasm::Name,_wasm::HeapType> *)
             ((long)&added.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  wasm::Module::addExport
            ((unique_ptr *)
             registered.val.super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_);
  std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr
            ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)local_60);
  registered.val.super__Variant_base<wasm::Ok,_wasm::Err>.
  super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_index = '\0';
  registered.val.super__Variant_base<wasm::Ok,_wasm::Err>.
  super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._33_7_ = 0;
  spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  addModule((Result<wasm::Ok> *)auStack_d8,this,(WASTModule *)&builder);
  if (added.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
    wasm::handle_unreachable
              ("error building spectest module",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-shell.cpp"
               ,499);
  }
  wasm::Name::Name((Name *)((long)&added.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),"spectest");
  addRegistration((Result<wasm::Ok> *)local_60,this,
                  (Register *)
                  ((long)&added.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  if (registered.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ != '\x01') {
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_60);
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)auStack_d8);
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>::
    ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                       *)&builder);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&spectest);
    return;
  }
  wasm::handle_unreachable
            ("error registering spectest module",
             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-shell.cpp"
             ,0x1f8);
}

Assistant:

void buildSpectestModule() {
    auto spectest = std::make_shared<Module>();
    spectest->features = FeatureSet::All;
    Builder builder(*spectest);

    spectest->addGlobal(builder.makeGlobal(Name::fromInt(0),
                                           Type::i32,
                                           builder.makeConst<uint32_t>(666),
                                           Builder::Immutable));
    spectest->addGlobal(builder.makeGlobal(Name::fromInt(1),
                                           Type::i64,
                                           builder.makeConst<uint64_t>(666),
                                           Builder::Immutable));
    spectest->addGlobal(builder.makeGlobal(Name::fromInt(2),
                                           Type::f32,
                                           builder.makeConst<float>(666.6f),
                                           Builder::Immutable));
    spectest->addGlobal(builder.makeGlobal(Name::fromInt(3),
                                           Type::f64,
                                           builder.makeConst<double>(666.6),
                                           Builder::Immutable));
    spectest->addExport(
      builder.makeExport("global_i32", Name::fromInt(0), ExternalKind::Global));
    spectest->addExport(
      builder.makeExport("global_i64", Name::fromInt(1), ExternalKind::Global));
    spectest->addExport(
      builder.makeExport("global_f32", Name::fromInt(2), ExternalKind::Global));
    spectest->addExport(
      builder.makeExport("global_f64", Name::fromInt(3), ExternalKind::Global));

    spectest->addTable(builder.makeTable(
      Name::fromInt(0), Type(HeapType::func, Nullable), 10, 20));
    spectest->addExport(
      builder.makeExport("table", Name::fromInt(0), ExternalKind::Table));

    spectest->addTable(builder.makeTable(
      Name::fromInt(1), Type(HeapType::func, Nullable), 10, 20, Type::i64));
    spectest->addExport(
      builder.makeExport("table64", Name::fromInt(1), ExternalKind::Table));

    Memory* memory =
      spectest->addMemory(builder.makeMemory(Name::fromInt(0), 1, 2));
    spectest->addExport(
      builder.makeExport("memory", memory->name, ExternalKind::Memory));

    // print_* functions are handled separately, no need to define here.

    WASTModule mod = std::move(spectest);
    auto added = addModule(mod);
    if (added.getErr()) {
      WASM_UNREACHABLE("error building spectest module");
    }
    Register registration{"spectest"};
    auto registered = addRegistration(registration);
    if (registered.getErr()) {
      WASM_UNREACHABLE("error registering spectest module");
    }
  }